

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::cpp_regex_traits_base<char,_1UL>::imbue
          (cpp_regex_traits_base<char,_1UL> *this,locale *loc)

{
  long lVar1;
  ctype *this_00;
  char allchars [256];
  mask tmp [256];
  char local_308 [256];
  mask local_208 [256];
  
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    local_308[lVar1] = (char)lVar1;
  }
  this_00 = std::use_facet<std::ctype<char>>(loc);
  std::ctype<char>::is((ctype<char> *)this_00,local_308,(char *)local_208,local_208);
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    this->masks_[lVar1] = local_208[lVar1];
  }
  *(byte *)(this->masks_ + 0x5f) = (byte)this->masks_[0x5f] | 0x80;
  *(byte *)(this->masks_ + 0x20) = (byte)this->masks_[0x20] | 0x40;
  *(uint *)(this->masks_ + 9) = *(uint *)(this->masks_ + 9) | 0x200040;
  *(uint *)(this->masks_ + 0xc) = *(uint *)(this->masks_ + 0xc) | 0x200020;
  return;
}

Assistant:

void imbue(std::locale const &loc)
        {
            int i = 0;
            Char allchars[UCHAR_MAX + 1];
            for(i = 0; i <= static_cast<int>(UCHAR_MAX); ++i)
            {
                allchars[i] = static_cast<Char>(i);
            }

            std::ctype<Char> const &ct = BOOST_USE_FACET(std::ctype<Char>, loc);
            std::ctype_base::mask tmp[UCHAR_MAX + 1];
            ct.is(allchars, allchars + UCHAR_MAX + 1, tmp);
            for(i = 0; i <= static_cast<int>(UCHAR_MAX); ++i)
            {
                this->masks_[i] = static_cast<umask_t>(tmp[i]);
                BOOST_ASSERT(0 == (this->masks_[i] & non_std_ctype_masks));
            }

            this->masks_[static_cast<unsigned char>('_')] |= non_std_ctype_underscore;
            this->masks_[static_cast<unsigned char>(' ')] |= non_std_ctype_blank;
            this->masks_[static_cast<unsigned char>('\t')] |= non_std_ctype_blank;
            this->masks_[static_cast<unsigned char>('\n')] |= non_std_ctype_newline;
            this->masks_[static_cast<unsigned char>('\r')] |= non_std_ctype_newline;
            this->masks_[static_cast<unsigned char>('\f')] |= non_std_ctype_newline;
        }